

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Core.cpp
# Opt level: O2

bool Rml::Initialise(void)

{
  _Head_base<0UL,_Rml::SystemInterface_*,_false> _Var1;
  FileInterface *pFVar2;
  FontEngineInterface *pFVar3;
  TextInputHandler *pTVar4;
  code *pcVar5;
  _Head_base<0UL,_Rml::RenderManager_*,_false> _Var6;
  bool bVar7;
  CoreData *pCVar8;
  __uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *this;
  _Head_base<0UL,_Rml::RenderManager_*,_false> local_10;
  
  if (initialised == '\x01') {
    bVar7 = Assert("Rml::Initialise() called, but RmlUi is already initialised!",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/Core.cpp"
                   ,0x6f);
    if (!bVar7) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
  }
  Detail::InitializeElementInstancerPools();
  ElementMetaPool::Initialize();
  LayoutPools::Initialize();
  InitializeComputeProperty();
  ControlledLifetimeResource<Rml::CoreData>::Initialize
            ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
  if (system_interface._M_head_impl == (SystemInterface *)0x0) {
    ::std::make_unique<Rml::SystemInterface>();
    pCVar8 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    _Var6._M_head_impl = local_10._M_head_impl;
    local_10._M_head_impl = (pointer)0x0;
    _Var1._M_head_impl =
         (pCVar8->default_system_interface)._M_t.
         super___uniq_ptr_impl<Rml::SystemInterface,_std::default_delete<Rml::SystemInterface>_>.
         _M_t.
         super__Tuple_impl<0UL,_Rml::SystemInterface_*,_std::default_delete<Rml::SystemInterface>_>.
         super__Head_base<0UL,_Rml::SystemInterface_*,_false>._M_head_impl;
    (pCVar8->default_system_interface)._M_t.
    super___uniq_ptr_impl<Rml::SystemInterface,_std::default_delete<Rml::SystemInterface>_>._M_t.
    super__Tuple_impl<0UL,_Rml::SystemInterface_*,_std::default_delete<Rml::SystemInterface>_>.
    super__Head_base<0UL,_Rml::SystemInterface_*,_false>._M_head_impl =
         (SystemInterface *)_Var6._M_head_impl;
    if (_Var1._M_head_impl != (SystemInterface *)0x0) {
      (*(_Var1._M_head_impl)->_vptr_SystemInterface[1])();
    }
    if (local_10._M_head_impl != (pointer)0x0) {
      (*(code *)(local_10._M_head_impl)->render_interface[1]._vptr_RenderInterface)();
    }
    pCVar8 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    system_interface._M_head_impl =
         (pCVar8->default_system_interface)._M_t.
         super___uniq_ptr_impl<Rml::SystemInterface,_std::default_delete<Rml::SystemInterface>_>.
         _M_t.
         super__Tuple_impl<0UL,_Rml::SystemInterface_*,_std::default_delete<Rml::SystemInterface>_>.
         super__Head_base<0UL,_Rml::SystemInterface_*,_false>._M_head_impl;
  }
  if (file_interface == (FileInterface *)0x0) {
    ::std::make_unique<Rml::FileInterfaceDefault>();
    pCVar8 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    _Var6._M_head_impl = local_10._M_head_impl;
    local_10._M_head_impl = (pointer)0x0;
    pFVar2 = (pCVar8->default_file_interface)._M_t.
             super___uniq_ptr_impl<Rml::FileInterface,_std::default_delete<Rml::FileInterface>_>.
             _M_t.
             super__Tuple_impl<0UL,_Rml::FileInterface_*,_std::default_delete<Rml::FileInterface>_>.
             super__Head_base<0UL,_Rml::FileInterface_*,_false>._M_head_impl;
    (pCVar8->default_file_interface)._M_t.
    super___uniq_ptr_impl<Rml::FileInterface,_std::default_delete<Rml::FileInterface>_>._M_t.
    super__Tuple_impl<0UL,_Rml::FileInterface_*,_std::default_delete<Rml::FileInterface>_>.
    super__Head_base<0UL,_Rml::FileInterface_*,_false>._M_head_impl =
         (FileInterface *)_Var6._M_head_impl;
    if (pFVar2 != (FileInterface *)0x0) {
      (*pFVar2->_vptr_FileInterface[1])();
      if (local_10._M_head_impl != (pointer)0x0) {
        (*(code *)(local_10._M_head_impl)->render_interface[1]._vptr_RenderInterface)();
      }
    }
    pCVar8 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    file_interface =
         (pCVar8->default_file_interface)._M_t.
         super___uniq_ptr_impl<Rml::FileInterface,_std::default_delete<Rml::FileInterface>_>._M_t.
         super__Tuple_impl<0UL,_Rml::FileInterface_*,_std::default_delete<Rml::FileInterface>_>.
         super__Head_base<0UL,_Rml::FileInterface_*,_false>._M_head_impl;
  }
  if (font_interface == (FontEngineInterface *)0x0) {
    ::std::make_unique<Rml::FontEngineInterfaceDefault>();
    pCVar8 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    _Var6._M_head_impl = local_10._M_head_impl;
    local_10._M_head_impl = (pointer)0x0;
    pFVar3 = (pCVar8->default_font_interface)._M_t.
             super___uniq_ptr_impl<Rml::FontEngineInterface,_std::default_delete<Rml::FontEngineInterface>_>
             ._M_t.
             super__Tuple_impl<0UL,_Rml::FontEngineInterface_*,_std::default_delete<Rml::FontEngineInterface>_>
             .super__Head_base<0UL,_Rml::FontEngineInterface_*,_false>._M_head_impl;
    (pCVar8->default_font_interface)._M_t.
    super___uniq_ptr_impl<Rml::FontEngineInterface,_std::default_delete<Rml::FontEngineInterface>_>.
    _M_t.
    super__Tuple_impl<0UL,_Rml::FontEngineInterface_*,_std::default_delete<Rml::FontEngineInterface>_>
    .super__Head_base<0UL,_Rml::FontEngineInterface_*,_false>._M_head_impl =
         (FontEngineInterface *)_Var6._M_head_impl;
    if (pFVar3 != (FontEngineInterface *)0x0) {
      (*pFVar3->_vptr_FontEngineInterface[1])();
      if (local_10._M_head_impl != (pointer)0x0) {
        (*(code *)(local_10._M_head_impl)->render_interface[1]._vptr_RenderInterface)();
      }
    }
    pCVar8 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    font_interface =
         (pCVar8->default_font_interface)._M_t.
         super___uniq_ptr_impl<Rml::FontEngineInterface,_std::default_delete<Rml::FontEngineInterface>_>
         ._M_t.
         super__Tuple_impl<0UL,_Rml::FontEngineInterface_*,_std::default_delete<Rml::FontEngineInterface>_>
         .super__Head_base<0UL,_Rml::FontEngineInterface_*,_false>._M_head_impl;
  }
  if (text_input_handler == (TextInputHandler *)0x0) {
    ::std::make_unique<Rml::TextInputHandler>();
    pCVar8 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    _Var6._M_head_impl = local_10._M_head_impl;
    local_10._M_head_impl = (pointer)0x0;
    pTVar4 = (pCVar8->default_text_input_handler)._M_t.
             super___uniq_ptr_impl<Rml::TextInputHandler,_std::default_delete<Rml::TextInputHandler>_>
             ._M_t.
             super__Tuple_impl<0UL,_Rml::TextInputHandler_*,_std::default_delete<Rml::TextInputHandler>_>
             .super__Head_base<0UL,_Rml::TextInputHandler_*,_false>._M_head_impl;
    (pCVar8->default_text_input_handler)._M_t.
    super___uniq_ptr_impl<Rml::TextInputHandler,_std::default_delete<Rml::TextInputHandler>_>._M_t.
    super__Tuple_impl<0UL,_Rml::TextInputHandler_*,_std::default_delete<Rml::TextInputHandler>_>.
    super__Head_base<0UL,_Rml::TextInputHandler_*,_false>._M_head_impl =
         (TextInputHandler *)_Var6._M_head_impl;
    if (pTVar4 != (TextInputHandler *)0x0) {
      (*pTVar4->_vptr_TextInputHandler[1])();
      if (local_10._M_head_impl != (pointer)0x0) {
        (*(code *)(local_10._M_head_impl)->render_interface[1]._vptr_RenderInterface)();
      }
    }
    pCVar8 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    text_input_handler =
         (pCVar8->default_text_input_handler)._M_t.
         super___uniq_ptr_impl<Rml::TextInputHandler,_std::default_delete<Rml::TextInputHandler>_>.
         _M_t.
         super__Tuple_impl<0UL,_Rml::TextInputHandler_*,_std::default_delete<Rml::TextInputHandler>_>
         .super__Head_base<0UL,_Rml::TextInputHandler_*,_false>._M_head_impl;
  }
  EventSpecificationInterface::Initialize();
  Detail::InitializeObserverPtrPool();
  if (render_interface != 0) {
    ::std::make_unique<Rml::RenderManager,Rml::RenderInterface*&>((RenderInterface **)&local_10);
    pCVar8 = ControlledLifetimeResource<Rml::CoreData>::operator->
                       ((ControlledLifetimeResource<Rml::CoreData> *)core_data);
    this = (__uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)
           itlib::
           flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
           ::operator[]<Rml::RenderInterface*&>
                     ((flat_map<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>,itlib::fmimpl::less,std::vector<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>,std::allocator<std::pair<Rml::RenderInterface*,std::unique_ptr<Rml::RenderManager,std::default_delete<Rml::RenderManager>>>>>>
                       *)&pCVar8->render_managers,(RenderInterface **)&render_interface);
    _Var6._M_head_impl = local_10._M_head_impl;
    local_10._M_head_impl = (pointer)0x0;
    ::std::__uniq_ptr_impl<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::reset
              (this,_Var6._M_head_impl);
    ::std::unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_>::~unique_ptr
              ((unique_ptr<Rml::RenderManager,_std::default_delete<Rml::RenderManager>_> *)&local_10
              );
  }
  (*font_interface->_vptr_FontEngineInterface[2])();
  StyleSheetSpecification::Initialise();
  StyleSheetParser::Initialise();
  StyleSheetFactory::Initialise();
  TemplateCache::Initialise();
  Factory::Initialise();
  PluginRegistry::NotifyInitialise();
  initialised = '\x01';
  return true;
}

Assistant:

bool Initialise()
{
	RMLUI_ASSERTMSG(!initialised, "Rml::Initialise() called, but RmlUi is already initialised!");

	InitializeMemoryPools();
	InitializeComputeProperty();

	core_data.Initialize();

	// Install default interfaces as appropriate.
	if (!system_interface)
	{
		core_data->default_system_interface = MakeUnique<SystemInterface>();
		system_interface = core_data->default_system_interface.get();
	}

	if (!file_interface)
	{
#ifndef RMLUI_NO_FILE_INTERFACE_DEFAULT
		core_data->default_file_interface = MakeUnique<FileInterfaceDefault>();
		file_interface = core_data->default_file_interface.get();
#else
		Log::Message(Log::LT_ERROR, "No file interface set!");
		return false;
#endif
	}

	if (!font_interface)
	{
#ifdef RMLUI_FONT_ENGINE_FREETYPE
		core_data->default_font_interface = MakeUnique<FontEngineInterfaceDefault>();
		font_interface = core_data->default_font_interface.get();
#else
		Log::Message(Log::LT_ERROR, "No font engine interface set!");
		return false;
#endif
	}

	if (!text_input_handler)
	{
		core_data->default_text_input_handler = MakeUnique<TextInputHandler>();
		text_input_handler = core_data->default_text_input_handler.get();
	}

	EventSpecificationInterface::Initialize();

	Detail::InitializeObserverPtrPool();

	if (render_interface)
		core_data->render_managers[render_interface] = MakeUnique<RenderManager>(render_interface);

	font_interface->Initialize();

	StyleSheetSpecification::Initialise();
	StyleSheetParser::Initialise();
	StyleSheetFactory::Initialise();

	TemplateCache::Initialise();

	Factory::Initialise();

	// Initialise plugins integrated with Core.
#ifdef RMLUI_LOTTIE_PLUGIN
	Lottie::Initialise();
#endif
#ifdef RMLUI_SVG_PLUGIN
	SVG::Initialise();
#endif

	// Notify all plugins we're starting up.
	PluginRegistry::NotifyInitialise();

	initialised = true;

	return true;
}